

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmGetPropertyCommand::HandleDirectoryMode(cmGetPropertyCommand *this)

{
  undefined8 this_00;
  bool bVar1;
  PolicyStatus PVar2;
  ulong uVar3;
  char *pcVar4;
  cmGlobalGenerator *this_01;
  PolicyID id;
  string local_c0;
  uint local_a0;
  allocator local_99;
  string local_98;
  cmLocalGenerator *local_78;
  cmLocalGenerator *lg;
  undefined1 local_40 [8];
  string dir;
  cmMakefile *mf;
  cmGetPropertyCommand *this_local;
  
  dir.field_2._8_8_ = (this->super_cmCommand).Makefile;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string((string *)local_40,(string *)&this->Name);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar4);
    if (!bVar1) {
      pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::operator=((string *)local_40,pcVar4);
      std::__cxx11::string::operator+=((string *)local_40,"/");
      std::__cxx11::string::operator+=((string *)local_40,(string *)&this->Name);
    }
    cmsys::SystemTools::CollapseFullPath((string *)&lg,(string *)local_40);
    std::__cxx11::string::operator=((string *)local_40,(string *)&lg);
    std::__cxx11::string::~string((string *)&lg);
    this_01 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    local_78 = cmGlobalGenerator::FindLocalGenerator(this_01,(string *)local_40);
    bVar1 = local_78 == (cmLocalGenerator *)0x0;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_98,
                 "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                 ,&local_99);
      cmCommand::SetError(&this->super_cmCommand,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      this_local._7_1_ = 0;
    }
    else {
      dir.field_2._8_8_ = cmLocalGenerator::GetMakefile(local_78);
    }
    local_a0 = (uint)bVar1;
    std::__cxx11::string::~string((string *)local_40);
    if (local_a0 != 0) goto LAB_004c3a06;
  }
  bVar1 = std::operator==(&this->PropertyName,"DEFINITIONS");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus((cmMakefile *)dir.field_2._8_8_,CMP0059);
    this_00 = dir.field_2._8_8_;
    if (PVar2 != OLD) {
      if (PVar2 != WARN) goto LAB_004c39db;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_c0,(cmPolicies *)0x3b,id);
      cmMakefile::IssueMessage((cmMakefile *)this_00,AUTHOR_WARNING,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    pcVar4 = cmMakefile::GetDefineFlagsCMP0059((cmMakefile *)dir.field_2._8_8_);
    this_local._7_1_ = StoreResult(this,pcVar4);
  }
  else {
LAB_004c39db:
    pcVar4 = cmMakefile::GetProperty((cmMakefile *)dir.field_2._8_8_,&this->PropertyName);
    this_local._7_1_ = StoreResult(this,pcVar4);
  }
LAB_004c3a06:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGetPropertyCommand::HandleDirectoryMode()
{
  // Default to the current directory.
  cmMakefile* mf = this->Makefile;

  // Lookup the directory if given.
  if(!this->Name.empty())
    {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = this->Name;
    if(!cmSystemTools::FileIsFullPath(dir.c_str()))
      {
      dir = this->Makefile->GetCurrentSourceDirectory();
      dir += "/";
      dir += this->Name;
      }

    // The local generators are associated with collapsed paths.
    dir = cmSystemTools::CollapseFullPath(dir);

    // Lookup the generator.
    if(cmLocalGenerator* lg =
       (this->Makefile->GetGlobalGenerator()->FindLocalGenerator(dir)))
      {
      // Use the makefile for the directory found.
      mf = lg->GetMakefile();
      }
    else
      {
      // Could not find the directory.
      this->SetError
        ("DIRECTORY scope provided but requested directory was not found. "
         "This could be because the directory argument was invalid or, "
         "it is valid but has not been processed yet.");
      return false;
      }
    }

  if (this->PropertyName == "DEFINITIONS")
    {
    switch(mf->GetPolicyStatus(cmPolicies::CMP0059))
      {
      case cmPolicies::WARN:
        mf->IssueMessage(cmake::AUTHOR_WARNING,
                         cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
      case cmPolicies::OLD:
        return this->StoreResult(mf->GetDefineFlagsCMP0059());
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        break;
      }
    }

  // Get the property.
  return this->StoreResult(mf->GetProperty(this->PropertyName));
}